

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O1

STAmount * jbcoin::divide(STAmount *__return_storage_ptr__,STAmount *num,STAmount *den,Issue *issue)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  mantissa_type mVar5;
  int iVar6;
  ulong divisor;
  int iVar7;
  ulong multiplier;
  bool bVar8;
  
  divisor = den->mValue;
  if (divisor != 0) {
    multiplier = num->mValue;
    if (multiplier == 0) {
      mVar5 = 0;
      iVar7 = 0;
      bVar8 = false;
    }
    else {
      iVar7 = num->mOffset;
      if ((multiplier < 1000000000000000) && (num->mIsNative != false)) {
        do {
          multiplier = multiplier * 10;
          iVar7 = iVar7 + -1;
        } while (multiplier < 1000000000000000);
      }
      iVar6 = den->mOffset;
      if ((divisor < 1000000000000000) && (den->mIsNative != false)) {
        do {
          divisor = divisor * 10;
          iVar6 = iVar6 + -1;
        } while (divisor < 1000000000000000);
      }
      uVar4 = muldiv(multiplier,100000000000000000,divisor);
      mVar5 = uVar4 + 5;
      iVar7 = (iVar7 - iVar6) + -0x11;
      bVar8 = num->mIsNegative != den->mIsNegative;
    }
    (__return_storage_ptr__->super_STBase).fName = (SField *)sfGeneric;
    (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d6f40;
    uVar1 = *(undefined8 *)((issue->currency).pn + 2);
    uVar2 = *(undefined8 *)((issue->currency).pn + 4);
    uVar3 = *(undefined8 *)((issue->account).pn + 1);
    *(undefined8 *)(__return_storage_ptr__->mIssue).currency.pn =
         *(undefined8 *)(issue->currency).pn;
    *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 2) = uVar1;
    *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = uVar2;
    *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 1) = uVar3;
    *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 3) =
         *(undefined8 *)((issue->account).pn + 3);
    __return_storage_ptr__->mValue = mVar5;
    __return_storage_ptr__->mOffset = iVar7;
    __return_storage_ptr__->mIsNegative = bVar8;
    STAmount::canonicalize(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"division by zero");
}

Assistant:

STAmount
divide (STAmount const& num, STAmount const& den, Issue const& issue)
{
    if (den == zero)
        Throw<std::runtime_error> ("division by zero");

    if (num == zero)
        return {issue};

    std::uint64_t numVal = num.mantissa();
    std::uint64_t denVal = den.mantissa();
    int numOffset = num.exponent();
    int denOffset = den.exponent();

    if (num.native())
    {
        while (numVal < STAmount::cMinValue)
        {
            // Need to bring into range
            numVal *= 10;
            --numOffset;
        }
    }

    if (den.native())
    {
        while (denVal < STAmount::cMinValue)
        {
            denVal *= 10;
            --denOffset;
        }
    }

    // We divide the two mantissas (each is between 10^15
    // and 10^16). To maintain precision, we multiply the
    // numerator by 10^17 (the product is in the range of
    // 10^32 to 10^33) followed by a division, so the result
    // is in the range of 10^16 to 10^15.
    return STAmount (issue,
        muldiv(numVal, tenTo17, denVal) + 5,
        numOffset - denOffset - 17,
        num.negative() != den.negative());
}